

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemFile.cpp
# Opt level: O2

ssize_t __thiscall MemFile::read(MemFile *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar4 = __nbytes & 0xffffffff;
  iVar3 = (int)__buf;
  if (iVar3 != 0) {
    uVar1 = (long)(*(int *)&(this->m_data).
                            super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                  *(int *)&(this->m_it)._M_current) / (long)iVar3;
    if ((int)uVar1 < (int)__nbytes) {
      uVar4 = uVar1 & 0xffffffff;
    }
    uVar2 = iVar3 * (int)uVar4;
    read(this,__fd,(void *)(ulong)uVar2,(ulong)uVar2);
  }
  return uVar4;
}

Assistant:

int MemFile::read(void* buf, int len, int count)
{
    if (!len) return count; // can read as many zero-length units as requested!

    auto avail_items = std::min(count, remaining() / len);
    read(buf, avail_items * len);
    return avail_items;
}